

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

_Bool section_covers_addr(MemoryRegionSection *section,hwaddr addr)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  int iVar1;
  int64_t iVar2;
  uint64_t len;
  undefined8 in_stack_ffffffffffffffb8;
  hwaddr offset;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar3;
  hwaddr addr_local;
  MemoryRegionSection *section_local;
  
  a._8_7_ = in_stack_ffffffffffffffc0;
  a._0_8_ = in_stack_ffffffffffffffb8;
  a[0xf] = in_stack_ffffffffffffffc7;
  iVar2 = int128_gethi((Int128)a);
  bVar3 = true;
  if (iVar2 == 0) {
    offset = section->offset_within_address_space;
    a_00._8_7_ = in_stack_ffffffffffffffc0;
    a_00._0_8_ = offset;
    a_00[0xf] = 1;
    len = int128_getlo((Int128)a_00);
    iVar1 = range_covers_byte(offset,len,addr);
    bVar3 = iVar1 != 0;
  }
  return bVar3;
}

Assistant:

static inline bool section_covers_addr(const MemoryRegionSection *section,
                                       hwaddr addr)
{
    /* Memory topology clips a memory region to [0, 2^64); size.hi > 0 means
     * the section must cover the entire address space.
     */
    return int128_gethi(section->size) ||
           range_covers_byte(section->offset_within_address_space,
                             int128_getlo(section->size), addr);
}